

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O2

size_t __thiscall image_hash::operator()(image_hash *this,Image *img)

{
  size_t sVar1;
  hash<std::basic_string_view<char,_std::char_traits<char>_>_> local_11;
  string_view local_10;
  
  local_10._M_str =
       (char *)(img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_10._M_len =
       (long)(img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)local_10._M_str;
  sVar1 = std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    (&local_11,&local_10);
  return sVar1;
}

Assistant:

std::size_t operator()(const Image& img) const {
		const char* beg = reinterpret_cast<const char*>(&*img.colorData.begin());
		const char* end = reinterpret_cast<const char*>(&*img.colorData.end());
#if __cplusplus >= 201703L
		return std::hash<std::string_view>()(std::string_view(beg, end - beg));
#else
		return std::hash<std::string>()(std::string(beg, end));
#endif
	}